

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void __thiscall
wasm::Random::Random(Random *this,vector<char,_std::allocator<char>_> *bytes_,FeatureSet features)

{
  bool bVar1;
  value_type local_21;
  vector<char,_std::allocator<char>_> *local_20;
  vector<char,_std::allocator<char>_> *bytes__local;
  Random *this_local;
  FeatureSet features_local;
  
  local_20 = bytes_;
  bytes__local = &this->bytes;
  this_local._4_4_ = features.features;
  std::vector<char,_std::allocator<char>_>::vector(&this->bytes,bytes_);
  this->pos = 0;
  this->finishedInput = false;
  this->xorFactor = 0;
  (this->features).features = this_local._4_4_;
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->bytes);
  if (bVar1) {
    local_21 = '\0';
    std::vector<char,_std::allocator<char>_>::push_back(&this->bytes,&local_21);
  }
  return;
}

Assistant:

Random::Random(std::vector<char>&& bytes_, FeatureSet features)
  : bytes(std::move(bytes_)), features(features) {
  // Ensure there is *some* input to be read.
  if (bytes.empty()) {
    bytes.push_back(0);
  }
}